

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopBalance.c
# Opt level: O0

Hop_Obj_t *
Hop_NodeBalanceBuildSuper(Hop_Man_t *p,Vec_Ptr_t *vSuper,Hop_Type_t Type,int fUpdateLevel)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *p1;
  int local_38;
  int LeftBound;
  Hop_Obj_t *pObj2;
  Hop_Obj_t *pObj1;
  int fUpdateLevel_local;
  Hop_Type_t Type_local;
  Vec_Ptr_t *vSuper_local;
  Hop_Man_t *p_local;
  
  if (1 < vSuper->nSize) {
    Vec_PtrSort(vSuper,Hop_NodeCompareLevelsDecrease);
    while (1 < vSuper->nSize) {
      if (fUpdateLevel == 0) {
        local_38 = 0;
      }
      else {
        local_38 = Hop_NodeBalanceFindLeft(vSuper);
      }
      Hop_NodeBalancePermute(p,vSuper,local_38,(uint)(Type == AIG_EXOR));
      pHVar1 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
      p1 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
      pHVar1 = Hop_Oper(p,pHVar1,p1,Type);
      Hop_NodeBalancePushUniqueOrderByLevel(vSuper,pHVar1);
    }
    pHVar1 = (Hop_Obj_t *)Vec_PtrEntry(vSuper,0);
    return pHVar1;
  }
  __assert_fail("vSuper->nSize > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopBalance.c"
                ,0xf7,
                "Hop_Obj_t *Hop_NodeBalanceBuildSuper(Hop_Man_t *, Vec_Ptr_t *, Hop_Type_t, int)");
}

Assistant:

Hop_Obj_t * Hop_NodeBalanceBuildSuper( Hop_Man_t * p, Vec_Ptr_t * vSuper, Hop_Type_t Type, int fUpdateLevel )
{
    Hop_Obj_t * pObj1, * pObj2;
    int LeftBound;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Hop_NodeCompareLevelsDecrease );
    // balance the nodes
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Hop_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Hop_NodeBalancePermute( p, vSuper, LeftBound, Type == AIG_EXOR );
        // pull out the last two nodes
        pObj1 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        pObj2 = (Hop_Obj_t *)Vec_PtrPop(vSuper);
        Hop_NodeBalancePushUniqueOrderByLevel( vSuper, Hop_Oper(p, pObj1, pObj2, Type) );
    }
    return (Hop_Obj_t *)Vec_PtrEntry(vSuper, 0);
}